

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O2

_Bool parse_view_position(element_t *element,int id,view_position_t *position)

{
  undefined4 uVar1;
  _Bool _Var2;
  string_t *psVar3;
  undefined4 in_register_00000034;
  undefined8 *puVar4;
  char *end;
  char *it;
  
  puVar4 = (undefined8 *)CONCAT44(in_register_00000034,id);
  psVar3 = find_attribute(element,0x16,false);
  if (psVar3 != (string_t *)0x0) {
    it = psVar3->data;
    end = it + psVar3->length;
    _Var2 = skip_string(&it,end,"none");
    if (_Var2) {
      *puVar4 = 0;
    }
    else {
      _Var2 = skip_string(&it,end,"xMinYMin");
      if (_Var2) {
        uVar1 = 1;
      }
      else {
        _Var2 = skip_string(&it,end,"xMidYMin");
        if (_Var2) {
          uVar1 = 2;
        }
        else {
          _Var2 = skip_string(&it,end,"xMaxYMin");
          if (_Var2) {
            uVar1 = 3;
          }
          else {
            _Var2 = skip_string(&it,end,"xMinYMid");
            if (_Var2) {
              uVar1 = 4;
            }
            else {
              _Var2 = skip_string(&it,end,"xMidYMid");
              if (_Var2) {
                uVar1 = 5;
              }
              else {
                _Var2 = skip_string(&it,end,"xMaxYMid");
                if (_Var2) {
                  uVar1 = 6;
                }
                else {
                  _Var2 = skip_string(&it,end,"xMinYMax");
                  if (_Var2) {
                    uVar1 = 7;
                  }
                  else {
                    _Var2 = skip_string(&it,end,"xMidYMax");
                    if (_Var2) {
                      uVar1 = 8;
                    }
                    else {
                      _Var2 = skip_string(&it,end,"xMaxYMax");
                      psVar3 = (string_t *)(ulong)_Var2;
                      if (!_Var2) goto LAB_00106705;
                      uVar1 = 9;
                    }
                  }
                }
              }
            }
          }
        }
      }
      *(undefined4 *)puVar4 = uVar1;
      *(undefined4 *)((long)puVar4 + 4) = 0;
      skip_ws(&it,end);
      _Var2 = skip_string(&it,end,"meet");
      if (_Var2) {
        *(undefined4 *)((long)puVar4 + 4) = 0;
      }
      else {
        _Var2 = skip_string(&it,end,"slice");
        if (_Var2) {
          *(undefined4 *)((long)puVar4 + 4) = 1;
        }
      }
    }
    _Var2 = skip_ws(&it,end);
    psVar3 = (string_t *)(ulong)_Var2;
  }
LAB_00106705:
  return SUB81(psVar3,0);
}

Assistant:

static bool parse_view_position(const element_t* element, int id, view_position_t* position)
{
    const string_t* value = find_attribute(element, id, false);
    if(value == NULL)
        return false;
    const char* it = value->data;
    const char* end = it + value->length;
    if(skip_string(&it, end, "none"))
        position->align = view_align_none;
    else if(skip_string(&it, end, "xMinYMin"))
        position->align = view_align_x_min_y_min;
    else if(skip_string(&it, end, "xMidYMin"))
        position->align = view_align_x_mid_y_min;
    else if(skip_string(&it, end, "xMaxYMin"))
        position->align = view_align_x_max_y_min;
    else if(skip_string(&it, end, "xMinYMid"))
        position->align = view_align_x_min_y_mid;
    else if(skip_string(&it, end, "xMidYMid"))
        position->align = view_align_x_mid_y_mid;
    else if(skip_string(&it, end, "xMaxYMid"))
        position->align = view_align_x_max_y_mid;
    else if(skip_string(&it, end, "xMinYMax"))
        position->align = view_align_x_min_y_max;
    else if(skip_string(&it, end, "xMidYMax"))
        position->align = view_align_x_mid_y_max;
    else if(skip_string(&it, end, "xMaxYMax"))
        position->align = view_align_x_max_y_max;
    else
        return false;
    position->scale = view_scale_meet;
    if(position->align != view_align_none) {
        skip_ws(&it, end);
        if(skip_string(&it, end, "meet"))
            position->scale = view_scale_meet;
        else if(skip_string(&it, end, "slice")) {
            position->scale = view_scale_slice;
        }
    }

    return !skip_ws(&it, end);
}